

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_23046::CommandLineParser::addOption(CommandLineParser *this,Option *O)

{
  bool bVar1;
  SubCommand *pSVar2;
  SubCommand *SC;
  iterator __end3;
  iterator __begin3;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range3;
  Option *O_local;
  CommandLineParser *this_local;
  
  bVar1 = llvm::SmallPtrSetImplBase::empty((SmallPtrSetImplBase *)&O->Subs);
  if (bVar1) {
    pSVar2 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::TopLevelSubCommand);
    addOption(this,O,pSVar2);
  }
  else {
    join_0x00000010_0x00000000_ =
         (SmallPtrSetIteratorImpl)
         llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                   (&(O->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    _SC = (SmallPtrSetIteratorImpl)
          llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    (&(O->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    while (bVar1 = llvm::SmallPtrSetIteratorImpl::operator!=
                             ((SmallPtrSetIteratorImpl *)&__end3.super_SmallPtrSetIteratorImpl.End,
                              (SmallPtrSetIteratorImpl *)&SC), bVar1) {
      pSVar2 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                         ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                          &__end3.super_SmallPtrSetIteratorImpl.End);
      addOption(this,O,pSVar2);
      llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                 &__end3.super_SmallPtrSetIteratorImpl.End);
    }
  }
  return;
}

Assistant:

void addOption(Option *O) {
    if (O->Subs.empty()) {
      addOption(O, &*TopLevelSubCommand);
    } else {
      for (auto SC : O->Subs)
        addOption(O, SC);
    }
  }